

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O0

char * gguf_get_key(gguf_context *ctx,int64_t key_id)

{
  int64_t iVar1;
  const_reference this;
  char *pcVar2;
  size_type in_RSI;
  long in_RDI;
  
  if (-1 < (long)in_RSI) {
    iVar1 = gguf_get_n_kv((gguf_context *)0x18ef89);
    if ((long)in_RSI < iVar1) {
      this = std::vector<gguf_kv,_std::allocator<gguf_kv>_>::operator[]
                       ((vector<gguf_kv,_std::allocator<gguf_kv>_> *)(in_RDI + 8),in_RSI);
      gguf_kv::get_key_abi_cxx11_(this);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      return pcVar2;
    }
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/gguf.cpp"
             ,0x2fb,"GGML_ASSERT(%s) failed","key_id >= 0 && key_id < gguf_get_n_kv(ctx)");
}

Assistant:

const char * gguf_get_key(const struct gguf_context * ctx, int64_t key_id) {
    GGML_ASSERT(key_id >= 0 && key_id < gguf_get_n_kv(ctx));
    return ctx->kv[key_id].get_key().c_str();
}